

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O2

bit_cost_t __thiscall
lzham::lzcompressor::state::get_lit_cost
          (state *this,search_accelerator *dict,uint dict_pos,uint lit_pred0,
          uint is_match_model_index)

{
  uchar *puVar1;
  byte bVar2;
  vector<unsigned_char> *pvVar3;
  uint uVar4;
  
  puVar1 = (dict->m_dict).m_p;
  bVar2 = puVar1[dict_pos];
  if ((this->super_state_base).m_cur_state < 7) {
    uVar4 = 0;
    if (1 < (int)(dict_pos - this->m_block_start_dict_ofs)) {
      uVar4 = puVar1[dict_pos - 2] >> 2 & 0x38;
    }
    pvVar3 = &this->m_lit_table[lit_pred0 >> 5 | uVar4].super_raw_quasi_adaptive_huffman_data_model.
              m_code_sizes;
  }
  else {
    uVar4 = (this->super_state_base).m_match_hist[0];
    bVar2 = bVar2 ^ puVar1[dict_pos - uVar4 & dict->m_max_dict_size_mask];
    pvVar3 = (vector<unsigned_char> *)
             (this->m_delta_lit_table[0].m_unused_alignment +
             ((ulong)(((uint)(puVar1[dict_pos - uVar4 & dict->m_max_dict_size_mask] >> 5) +
                      (uint)(puVar1[~uVar4 + dict_pos & dict->m_max_dict_size_mask] >> 5) * 8) *
                     0x80) - 0x30));
  }
  return (long)(int)((uint)pvVar3->m_p[bVar2] << 0x18) +
         (ulong)*(uint *)(gProbCost +
                         (ulong)*(ushort *)
                                 ((long)(&this->super_state_base + 1) +
                                 (ulong)is_match_model_index * 2 + 4) * 4);
}

Assistant:

bit_cost_t lzcompressor::state::get_lit_cost(const search_accelerator& dict, uint dict_pos, uint lit_pred0, uint is_match_model_index) const
   {
      bit_cost_t cost = m_is_match_model[is_match_model_index].get_cost(0);

      const uint lit = dict[dict_pos];

      if (m_cur_state < CLZBase::cNumLitStates)
      {
         // literal
         const uint lit_pred1 = get_pred_char(dict, dict_pos, 2);

         uint lit_pred = (lit_pred0 >> (8 - CLZBase::cNumLitPredBits/2)) |
            (((lit_pred1 >> (8 - CLZBase::cNumLitPredBits/2)) << CLZBase::cNumLitPredBits/2));

         cost += m_lit_table[lit_pred].get_cost(lit);
      }
      else
      {
         // delta literal
         const uint rep_lit0 = dict[(dict_pos - m_match_hist[0]) & dict.m_max_dict_size_mask];
         const uint rep_lit1 = dict[(dict_pos - m_match_hist[0] - 1) & dict.m_max_dict_size_mask];

         uint delta_lit = rep_lit0 ^ lit;

         uint lit_pred = (rep_lit0 >> (8 - CLZBase::cNumDeltaLitPredBits/2)) |
            ((rep_lit1 >> (8 - CLZBase::cNumDeltaLitPredBits/2)) << CLZBase::cNumDeltaLitPredBits/2);

         cost += m_delta_lit_table[lit_pred].get_cost(delta_lit);
      }

      return cost;
   }